

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

void membuf_delete(membuf **sbp)

{
  membuf *sb_00;
  membuf *sb;
  membuf **sbp_local;
  
  sb_00 = *sbp;
  membuf_free(sb_00);
  free(sb_00);
  *sbp = (membuf *)0x0;
  return;
}

Assistant:

void membuf_delete(struct membuf **sbp)
{
    struct membuf *sb;

    sb = *sbp;
    membuf_free(sb);
    free(sb);
    sb = NULL;
    *sbp = sb;
}